

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

void __thiscall PhyloTree::setLeaf2NumMapFromNewick(PhyloTree *this,string *s)

{
  pointer pcVar1;
  size_t end;
  ulong uVar2;
  ulong i;
  string label;
  string local_70;
  string local_50;
  
  uVar2 = 0;
  while (i = uVar2, i < s->_M_string_length) {
    pcVar1 = (s->_M_dataplus)._M_p;
    if ((byte)(pcVar1[i] | 4U) == 0x2c) {
      uVar2 = i + 1;
      if (pcVar1[i + 1] != '(') {
        end = Tools::nextIndex(s,i,":");
        std::__cxx11::string::string((string *)&local_70,(string *)s);
        Tools::substring(&local_50,&local_70,i + 1,end);
        std::__cxx11::string::~string((string *)&local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->leaf2NumMap,&local_50);
        uVar2 = Tools::nextIndex(s,i,",)");
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    else {
      uVar2 = i + 1;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void PhyloTree::setLeaf2NumMapFromNewick(string& s) {
    // go through the string and pull out all the leaf labels:  any string between '(' and ':' or ',' and ':'
    size_t i = 0;
    while (i < s.length()) {
        // however, the first character might be the beginning of a leaf label
        if ((s[i] == '(' || s[i] == ',') && (s[i + 1] != '(')) {
            size_t end_of_label = Tools::nextIndex(s, i, ":");
            string label = Tools::substring(s, i + 1, end_of_label);
            leaf2NumMap.push_back(label);
            i = Tools::nextIndex(s, i, ",)");
        } else {
            i++;
        }
    }
    // sort the elements of leaf2NumMap
    std::sort(leaf2NumMap.begin(), leaf2NumMap.end());
}